

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int isoent_collect_dirs(vdd *vdd,isoent *rootent,int depth)

{
  path_table *ppVar1;
  isoent *piVar2;
  int iVar3;
  isoent *piVar4;
  
  piVar4 = rootent;
  if (rootent == (isoent *)0x0) {
    rootent = vdd->rootent;
    piVar4 = rootent;
  }
  do {
    ppVar1 = vdd->pathtbl;
    rootent->ptnext = (isoent *)0x0;
    *ppVar1[depth].last = rootent;
    ppVar1[depth].last = &rootent->ptnext;
    ppVar1[depth].cnt = ppVar1[depth].cnt + 1;
    piVar2 = (rootent->subdirs).first;
    if ((piVar2 == (isoent *)0x0) || (iVar3 = depth + 1, vdd->max_depth <= depth + 1)) {
      for (; (piVar2 = rootent, iVar3 = depth, rootent != piVar4 &&
             (piVar2 = rootent->drnext, rootent->drnext == (isoent *)0x0));
          rootent = rootent->parent) {
        depth = depth + -1;
      }
    }
    depth = iVar3;
    rootent = piVar2;
  } while (rootent != piVar4);
  return (int)rootent;
}

Assistant:

static int
isoent_collect_dirs(struct vdd *vdd, struct isoent *rootent, int depth)
{
	struct isoent *np;

	if (rootent == NULL)
		rootent = vdd->rootent;
	np = rootent;
	do {
		/* Register current directory to pathtable. */
		path_table_add_entry(&(vdd->pathtbl[depth]), np);

		if (np->subdirs.first != NULL && depth + 1 < vdd->max_depth) {
			/* Enter to sub directories. */
			np = np->subdirs.first;
			depth++;
			continue;
		}
		while (np != rootent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != rootent);

	return (ARCHIVE_OK);
}